

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

Vec_Int_t * Gia_SweeperCollectValidProbeIds(Gia_Man_t *p)

{
  void *pvVar1;
  Vec_Int_t *p_00;
  int iVar2;
  Vec_Int_t *p_01;
  int i;
  
  pvVar1 = p->pData;
  p_01 = Vec_IntAlloc(1000);
  for (i = 0; p_00 = *(Vec_Int_t **)((long)pvVar1 + 0x10), i < p_00->nSize; i = i + 1) {
    iVar2 = Vec_IntEntry(p_00,i);
    if (-1 < iVar2) {
      Vec_IntPush(p_01,i);
    }
  }
  return p_01;
}

Assistant:

Vec_Int_t * Gia_SweeperCollectValidProbeIds( Gia_Man_t * p )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    Vec_Int_t * vProbeIds = Vec_IntAlloc( 1000 );
    int iLit, ProbeId;
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        Vec_IntPush( vProbeIds, ProbeId );
    }
    return vProbeIds;
}